

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O0

void __thiscall obx::Store::Store(Store *this,Store *source)

{
  __pointer_type __p;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lock;
  Store *source_local;
  Store *this_local;
  
  this->_vptr_Store = (_func_int **)&PTR__Store_001257a8;
  lock._M_device = (mutex_type *)source;
  __p = std::atomic<OBX_store_*>::load(&source->cStore_,memory_order_seq_cst);
  std::atomic<OBX_store_*>::atomic(&this->cStore_,__p);
  this->owned_ = (bool)(((lock._M_device)->super___mutex_base)._M_mutex.__size[0x10] & 1);
  std::shared_ptr<obx::Closable>::shared_ptr(&this->syncClient_);
  std::mutex::mutex(&this->syncClientMutex_);
  std::atomic<OBX_store_*>::operator=
            ((atomic<OBX_store_*> *)((long)&((lock._M_device)->super___mutex_base)._M_mutex + 8),
             (__pointer_type)0x0);
  std::lock_guard<std::mutex>::lock_guard(&local_20,lock._M_device + 1);
  std::shared_ptr<obx::Closable>::operator=
            (&this->syncClient_,
             (shared_ptr<obx::Closable> *)
             &((lock._M_device)->super___mutex_base)._M_mutex.__data.__list);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

Store::Store(Store&& source) noexcept : cStore_(source.cStore_.load()), owned_(source.owned_) {
    source.cStore_ = nullptr;
    std::lock_guard<std::mutex> lock(source.syncClientMutex_);
    syncClient_ = std::move(source.syncClient_);
}